

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

void __thiscall
QPDF::processMemoryFile(QPDF *this,char *description,char *buf,size_t length,char *password)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  BufferInputSource *this_00;
  Buffer *this_01;
  uchar *buf_00;
  allocator<char> local_69;
  char *local_68;
  string local_60;
  BufferInputSource *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68 = password;
  this_00 = (BufferInputSource *)operator_new(0xe8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,description,&local_69);
  this_01 = (Buffer *)operator_new(8);
  buf_00 = QUtil::unsigned_char_pointer(buf);
  Buffer::Buffer(this_01,buf_00,length);
  BufferInputSource::BufferInputSource(this_00,&local_60,this_01,true);
  local_40 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BufferInputSource*>
            (&local_38,this_00);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  *(BufferInputSource **)
   &((_Var1._M_head_impl)->file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> =
       local_40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var1._M_head_impl)->file + 8),
             &local_38);
  parse(this,local_68);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDF::processMemoryFile(
    char const* description, char const* buf, size_t length, char const* password)
{
    processInputSource(
        std::shared_ptr<InputSource>(
            // line-break
            new BufferInputSource(
                description, new Buffer(QUtil::unsigned_char_pointer(buf), length), true)),
        password);
}